

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O1

void __thiscall db_packer::process(db_packer *this,cl_parser *cl)

{
  uint8_t *puVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer pbVar5;
  pointer ppdVar6;
  db_file *pdVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  xr_file_system *this_00;
  xr_writer *pxVar12;
  xr_reader *pxVar13;
  xr_memory_writer *this_01;
  undefined4 extraout_var;
  _lzhuf *this_02;
  ulong uVar14;
  pointer pbVar15;
  pointer ppdVar16;
  char *pcVar17;
  size_type sVar18;
  uint8_t *data;
  size_t size;
  char *userdata;
  string target;
  string extension;
  xr_scrambler scrambler;
  uint8_t *local_2a8;
  size_t local_2a0;
  ulong local_298;
  string *local_290;
  char *local_288;
  string local_280;
  string local_260;
  size_t local_240;
  undefined1 local_238 [520];
  
  if (cl->m_num_params != 1) {
    xray_re::msg("incorrect number of parameters");
    return;
  }
  pcVar17 = cl->m_options[cl->m_argc - 1].name;
  bVar8 = xray_re::xr_file_system::folder_exist(pcVar17);
  if (!bVar8) {
    xray_re::msg("can\'t find %s",pcVar17);
    return;
  }
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  bVar8 = cl_parser::get_string(cl,"-out",&local_280);
  if (!bVar8) {
    xray_re::msg("unspecifed output file");
    goto LAB_00120eb2;
  }
  xray_re::xr_file_system::split_path
            (local_280._M_dataplus._M_p,(string *)0x0,(string *)0x0,&local_260);
  bVar8 = cl_parser::get_bool(cl,"-11xx");
  pcVar17 = "unsupported DB format";
  if (!bVar8) {
    bVar8 = cl_parser::get_bool(cl,"-2215");
    if (!bVar8) {
      bVar8 = cl_parser::get_bool(cl,"-2945");
      if (!bVar8) {
        bVar8 = cl_parser::get_bool(cl,"-2947ru");
        bVar9 = cl_parser::get_bool(cl,"-2947ww");
        uVar14 = (ulong)((uint)bVar8 * 8 + 0x10);
        if (!bVar9) {
          uVar14 = (ulong)bVar8 << 3;
        }
        bVar8 = cl_parser::get_bool(cl,"-xdb");
        if (bVar8) {
LAB_00120d8f:
          uVar14 = (ulong)((uint)uVar14 | 0x20);
        }
        else {
          bVar8 = db_tools::is_xdb(&local_260);
          if (bVar8) goto LAB_00120d8f;
        }
        uVar10 = (uint)uVar14 - 1;
        local_298 = uVar14;
        if (uVar10 < ((uint)uVar14 ^ uVar10)) {
          this_00 = xray_re::xr_file_system::instance();
          pxVar12 = xray_re::xr_file_system::w_open(this_00,local_280._M_dataplus._M_p,false);
          this->m_archive = pxVar12;
          if (pxVar12 == (xr_writer *)0x0) {
            xray_re::msg("can\'t load %s",local_280._M_dataplus._M_p);
          }
          else {
            if ((int)local_298 == 0x20) {
              bVar8 = cl_parser::get_string(cl,"-xdb_ud",&local_288);
              if (bVar8) {
                pxVar13 = xray_re::xr_file_system::r_open(this_00,local_288);
                if (pxVar13 == (xr_reader *)0x0) {
                  xray_re::msg("can\'t load %s");
                }
                else {
                  xray_re::xr_writer::open_chunk(this->m_archive,0x29a);
                  puVar1 = pxVar13->m_data;
                  if (pxVar13->m_end < puVar1) {
                    __assert_fail("m_data <= m_end",
                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                                  ,0x7a,"size_t xray_re::xr_reader::size() const");
                  }
                  (*this->m_archive->_vptr_xr_writer[2])
                            (this->m_archive,puVar1,(long)pxVar13->m_end - (long)puVar1);
                  xray_re::xr_writer::close_chunk(this->m_archive);
                  (*pxVar13->_vptr_xr_reader[1])(pxVar13);
                }
              }
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0);
            local_240 = cl->m_num_params;
            if (local_240 != 0) {
              local_290 = &this->m_root;
              uVar14 = 0;
              do {
                pcVar17 = cl->m_options[cl->m_argc + ~uVar14].name;
                pcVar2 = (char *)(this->m_root)._M_string_length;
                strlen(pcVar17);
                std::__cxx11::string::_M_replace((ulong)local_290,0,pcVar2,(ulong)pcVar17);
                sVar3 = (this->m_root)._M_string_length;
                if (sVar3 != 0) {
                  pcVar4 = (this->m_root)._M_dataplus._M_p;
                  sVar18 = 0;
                  do {
                    iVar11 = tolower((int)pcVar4[sVar18]);
                    pcVar4[sVar18] = (char)iVar11;
                    sVar18 = sVar18 + 1;
                  } while (sVar3 != sVar18);
                }
                xray_re::xr_file_system::append_path_separator(local_290);
                local_238._0_8_ = local_238 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
                process_folder(this,(string *)local_238);
                if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                  operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != local_240);
            }
            xray_re::xr_writer::close_chunk(this->m_archive);
            this_01 = (xr_memory_writer *)operator_new(0x2078);
            xray_re::xr_memory_writer::xr_memory_writer(this_01);
            xray_re::msg("folders:");
            pbVar15 = (this->m_folders).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar5 = (this->m_folders).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pbVar15 != pbVar5) {
              do {
                local_238._0_2_ = (short)(int)pbVar15->_M_string_length + 0x10;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,2);
                local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])
                          (this_01,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
                xray_re::msg("  %s",(pbVar15->_M_dataplus)._M_p);
                local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                pbVar15 = pbVar15 + 1;
              } while (pbVar15 != pbVar5);
            }
            xray_re::msg("files: ");
            ppdVar16 = (this->m_files).
                       super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppdVar6 = (this->m_files).
                      super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppdVar16 != ppdVar6) {
              do {
                pdVar7 = *ppdVar16;
                local_238._0_2_ = (short)(int)(pdVar7->path)._M_string_length + 0x10;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,2);
                local_238._0_4_ = (int)pdVar7->size_real;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                local_238._0_4_ = (undefined4)pdVar7->size_compressed;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                local_238._0_4_ = pdVar7->crc;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])
                          (this_01,(pdVar7->path)._M_dataplus._M_p,(pdVar7->path)._M_string_length);
                xray_re::msg("  %s",(pdVar7->path)._M_dataplus._M_p);
                local_238._0_4_ = (int)pdVar7->offset;
                (*(this_01->super_xr_writer)._vptr_xr_writer[2])(this_01,local_238,4);
                ppdVar16 = ppdVar16 + 1;
              } while (ppdVar16 != ppdVar6);
            }
            local_2a8 = (uint8_t *)0x0;
            local_2a0 = 0;
            puVar1 = (this_01->m_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar11 = (*(this_01->super_xr_writer)._vptr_xr_writer[4])(this_01);
            this_02 = &xray_re::xr_lzhuf::instance()->m_lzhuf;
            xray_re::_lzhuf::Encode
                      (this_02,&local_2a8,&local_2a0,puVar1,CONCAT44(extraout_var,iVar11));
            (*(this_01->super_xr_writer)._vptr_xr_writer[1])(this_01);
            if ((int)local_298 == 0x10) {
              xray_re::xr_scrambler::init((xr_scrambler *)local_238,(EVP_PKEY_CTX *)0x1);
              xray_re::xr_scrambler::encrypt
                        ((xr_scrambler *)local_238,(char *)local_2a8,(int)local_2a8);
            }
            else if ((int)local_298 == 8) {
              xray_re::xr_scrambler::init((xr_scrambler *)local_238,(EVP_PKEY_CTX *)0x0);
              xray_re::xr_scrambler::encrypt
                        ((xr_scrambler *)local_238,(char *)local_2a8,(int)local_2a8);
            }
            xray_re::xr_writer::open_chunk(this->m_archive,0x80000001);
            (*this->m_archive->_vptr_xr_writer[2])(this->m_archive,local_2a8,local_2a0);
            xray_re::xr_writer::close_chunk(this->m_archive);
            if (local_2a8 != (uint8_t *)0x0) {
              operator_delete(local_2a8,1);
            }
            if (this->m_archive != (xr_writer *)0x0) {
              (*this->m_archive->_vptr_xr_writer[1])();
            }
            this->m_archive = (xr_writer *)0x0;
          }
          goto LAB_00120eb2;
        }
        pcVar17 = "unspecified DB format";
      }
    }
  }
  xray_re::msg(pcVar17);
LAB_00120eb2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void db_packer::process(const cl_parser& cl)
{
	if (cl.num_params() != 1) {
		msg("incorrect number of parameters");
		return;
	}

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(0);
		if (!xr_file_system::folder_exist(source)) {
			msg("can't find %s", source);
			return;
		}
	}

	std::string target, extension;
	if (!cl.get_string("-out", target)) {
		msg("unspecifed output file");
		return;
	}
	xr_file_system::split_path(target, 0, 0, &extension);

	unsigned version = DB_VERSION_AUTO;
	if (cl.get_bool("-11xx") || cl.get_bool("-2215") || cl.get_bool("-2945")) {
		msg("unsupported DB format");
		return;
	}
	if (cl.get_bool("-2947ru"))
		version |= DB_VERSION_2947RU;
	if (cl.get_bool("-2947ww"))
		version |= DB_VERSION_2947WW;
	if (cl.get_bool("-xdb") || is_xdb(extension))
		version |= DB_VERSION_XDB;
	if (version == DB_VERSION_AUTO || (version & (version - 1)) != 0) {
		msg("unspecified DB format");
		return;
	}

	xr_file_system& fs = xr_file_system::instance();
	m_archive = fs.w_open(target);
	if (m_archive == 0) {
		msg("can't load %s", target.c_str());
		return;
	}

	const char* userdata;
	if (version == DB_VERSION_XDB && cl.get_string("-xdb_ud", userdata)) {
		if (xr_reader* r = fs.r_open(userdata)) {
			m_archive->open_chunk(DB_CHUNK_USERDATA);
			m_archive->w_raw(r->data(), r->size());
			m_archive->close_chunk();
			fs.r_close(r);
		} else {
			msg("can't load %s", userdata);
		}
	}

	m_archive->open_chunk(DB_CHUNK_DATA);
	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		m_root = cl.param(i);
		xr_strlwr(m_root);
		xr_file_system::append_path_separator(m_root);
		process_folder();
	}
	m_archive->close_chunk();

	xr_memory_writer* w = new xr_memory_writer;
	msg("folders:");
	for (std::vector<std::string>::iterator it = m_folders.begin(),
			end = m_folders.end(); it != end; ++it) {
		w->w_size_u16(it->size() + 16);
		w->w_u32(0);
		w->w_u32(0);
		w->w_u32(0);
		w->w_raw(it->data(), it->size());
		msg("  %s", it->c_str());
		w->w_u32(0);
	}
	msg("files: ");
	for (std::vector<db_file*>::iterator it = m_files.begin(),
			end = m_files.end(); it != end; ++it) {
		db_file* file = *it;
		w->w_size_u16(file->path.size() + 16);
		w->w_size_u32(file->size_real);
		w->w_size_u32(file->size_compressed);
		w->w_u32(file->crc);
		w->w_raw(file->path.data(), file->path.size());
		msg("  %s", file->path.c_str());
		w->w_size_u32(file->offset);
	}
	uint8_t* data = 0;
	size_t size = 0;
	xr_lzhuf::compress(data, size, w->data(), w->tell());
	delete w;
	if (version == DB_VERSION_2947RU) {
		xr_scrambler scrambler(xr_scrambler::CC_RU);
		scrambler.encrypt(data, data, size);
	} else if (version == DB_VERSION_2947WW) {
		xr_scrambler scrambler(xr_scrambler::CC_WW);
		scrambler.encrypt(data, data, size);
	}
	m_archive->open_chunk(DB_CHUNK_HEADER|xr_reader::CHUNK_COMPRESSED);
	m_archive->w_raw(data, size);
	m_archive->close_chunk();
	delete data;
	fs.w_close(m_archive);
}